

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O1

void __thiscall CMU462::DynamicScene::XFormWidget::drawRotateHandles(XFormWidget *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  pointer pVVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double __x;
  double dVar18;
  double dVar19;
  Vector3D q2;
  Vector3D q1;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if ((this->target).object != (SceneObject *)0x0) {
    dVar1 = (this->center).x;
    dVar2 = (this->center).y;
    dVar16 = (this->bounds).max.x - (this->bounds).min.x;
    dVar18 = (this->bounds).max.y - (this->bounds).min.y;
    dVar3 = (this->center).z;
    dVar14 = (this->bounds).max.z - (this->bounds).min.z;
    dVar14 = dVar14 * dVar14 + dVar16 * dVar16 + dVar18 * dVar18;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      dVar14 = SQRT(dVar14);
    }
    dVar14 = dVar14 * 0.5;
    glLineWidth(0x41000000);
    glBegin(1);
    uVar12 = 0;
    do {
      uVar13 = uVar12 + 1;
      uVar11 = 0;
      if (uVar13 != 3) {
        uVar11 = uVar13 & 0xffffffff;
      }
      pVVar8 = (this->axes).super__Vector_base<CMU462::Vector3D,_std::allocator<CMU462::Vector3D>_>.
               _M_impl.super__Vector_impl_data._M_start;
      dVar16 = pVVar8[uVar11].x;
      dVar18 = pVVar8[uVar11].y;
      dVar4 = pVVar8[uVar11].z;
      uVar9 = ((int)uVar12 + 2U) % 3;
      dVar5 = pVVar8[uVar9].x;
      dVar6 = pVVar8[uVar9].y;
      dVar7 = pVVar8[uVar9].z;
      glColor4ubv((this->axisColors).
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar12].
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
      dVar17 = 0.0;
      iVar10 = 1;
      do {
        dVar19 = dVar17 * 6.283185307179586 * 0.015625;
        dVar17 = dVar17 + 1.0;
        __x = (double)iVar10 * 6.283185307179586 * 0.015625;
        dVar15 = cos(dVar19);
        dVar19 = sin(dVar19);
        local_48 = (dVar16 * dVar15 - dVar5 * dVar19) * dVar14 + dVar1;
        local_40 = (dVar18 * dVar15 - dVar6 * dVar19) * dVar14 + dVar2;
        local_38 = (dVar15 * dVar4 - dVar19 * dVar7) * dVar14 + dVar3;
        dVar15 = cos(__x);
        dVar19 = sin(__x);
        local_60 = (dVar16 * dVar15 - dVar5 * dVar19) * dVar14 + dVar1;
        local_58 = (dVar18 * dVar15 - dVar6 * dVar19) * dVar14 + dVar2;
        local_50 = (dVar15 * dVar4 - dVar19 * dVar7) * dVar14 + dVar3;
        glVertex3dv(&local_48);
        glVertex3dv(&local_60);
        iVar10 = iVar10 + 1;
      } while (iVar10 != 0x41);
      uVar12 = uVar13;
    } while (uVar13 != 3);
    glEnd();
    drawCenterHandle(this);
    glLineWidth(0x3f800000);
  }
  return;
}

Assistant:

void XFormWidget::drawRotateHandles() const
{
   const double boxSize = .2;
   const int nSides = 64;

   if( target.object == nullptr ) return;
   
   Vector3D c = center;
   double r = (bounds.max - bounds.min).norm() / 2.;

   glLineWidth( 8. );
   glBegin( GL_LINES );
   for( int i = 0; i < 3; i++ )
   {
      Vector3D e1 = axes[(i+1)%3];
      Vector3D e2 = axes[(i+2)%3];

      glColor4ubv( &axisColors[i][0] );

      for( int j = 0; j < nSides; j++ )
      {
         double theta1 = 2.*M_PI * (double)(j+0) / (double)nSides;
         double theta2 = 2.*M_PI * (double)(j+1) / (double)nSides;

         Vector3D q1 = c + r * ( cos(theta1)*e1 - sin(theta1)*e2 );
         Vector3D q2 = c + r * ( cos(theta2)*e1 - sin(theta2)*e2 );

         glVertex3dv( &q1.x );
         glVertex3dv( &q2.x );
      }
   }
   glEnd();

   drawCenterHandle();

   glLineWidth( 1. );
}